

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cc
# Opt level: O2

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall
assembler::Assembler::process
          (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           *__return_storage_ptr__,Assembler *this,VCDU *vcdu)

{
  iterator iVar1;
  int vcid;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  out;
  uint local_12c;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  local_128;
  VirtualChannel local_108;
  pair<int,_assembler::VirtualChannel> local_98;
  
  local_128.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12c = vcdu->data_->_M_elems[1] & 0x3f;
  if (local_12c == 0x3f) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
            ::find((_Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
                    *)this,(key_type *)&local_12c);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->vcs_)._M_t._M_impl.super__Rb_tree_header) {
      VirtualChannel::VirtualChannel(&local_108,local_12c);
      local_98.first = local_12c;
      VirtualChannel::VirtualChannel(&local_98.second,&local_108);
      std::
      _Rb_tree<int,std::pair<int_const,assembler::VirtualChannel>,std::_Select1st<std::pair<int_const,assembler::VirtualChannel>>,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
      ::_M_emplace_unique<std::pair<int,assembler::VirtualChannel>>
                ((_Rb_tree<int,std::pair<int_const,assembler::VirtualChannel>,std::_Select1st<std::pair<int_const,assembler::VirtualChannel>>,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
                  *)this,&local_98);
      VirtualChannel::~VirtualChannel(&local_98.second);
      VirtualChannel::~VirtualChannel(&local_108);
    }
    iVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
            ::find((_Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
                    *)this,(key_type *)&local_12c);
    VirtualChannel::process
              (__return_storage_ptr__,(VirtualChannel *)&iVar1._M_node[1]._M_parent,vcdu);
  }
  std::
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ::~vector(&local_128);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> Assembler::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;

  // Ignore fill packets
  auto vcid = vcdu.getVCID();
  if (vcid == 63) {
    return out;
  }

  // Create virtual channel instance if it does not yet exist
  if (vcs_.find(vcid) == vcs_.end()) {
    vcs_.insert(std::make_pair(vcid, VirtualChannel(vcid)));
  }

  // Let virtual channel process VCDU
  auto it = vcs_.find(vcid);
  return it->second.process(vcdu);
}